

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

size_t WOPN_CalculateBankFileSize(WOPNFile *file,uint16_t version)

{
  long lVar1;
  long local_30;
  size_t ins_size;
  size_t final_size;
  uint16_t version_local;
  WOPNFile *file_local;
  
  final_size._6_2_ = version;
  if (version == 0) {
    final_size._6_2_ = 2;
  }
  if (file == (WOPNFile *)0x0) {
    file_local = (WOPNFile *)0x0;
  }
  else {
    lVar1 = 0x12;
    if (final_size._6_2_ < 2) {
      local_30 = 0x41;
    }
    else {
      lVar1 = (long)(int)((uint)file->banks_count_percussion * 0x22) +
              (long)(int)((uint)file->banks_count_melodic * 0x22) + 0x12;
      local_30 = 0x45;
    }
    file_local = (WOPNFile *)
                 (local_30 * 0x80 * (ulong)file->banks_count_percussion +
                 local_30 * 0x80 * (ulong)file->banks_count_melodic + lVar1);
  }
  return (size_t)file_local;
}

Assistant:

size_t WOPN_CalculateBankFileSize(WOPNFile *file, uint16_t version)
{
    size_t final_size = 0;
    size_t ins_size = 0;

    if(version == 0)
        version = wopn_latest_version;

    if(!file)
        return 0;
    final_size += 11 + 2 + 2 + 2 + 1;
    /*
     * Magic number,
     * Version,
     * Count of melodic banks,
     * Count of percussive banks,
     * Chip specific flags
     */

    if(version >= 2)
    {
        /* Melodic banks meta-data */
        final_size += (32 + 1 + 1) * file->banks_count_melodic;
        /* Percussive banks meta-data */
        final_size += (32 + 1 + 1) * file->banks_count_percussion;
    }

    if(version >= 2)
        ins_size = WOPN_INST_SIZE_V2;
    else
        ins_size = WOPN_INST_SIZE_V1;
    /* Melodic instruments */
    final_size += (ins_size * 128) * file->banks_count_melodic;
    /* Percussive instruments */
    final_size += (ins_size * 128) * file->banks_count_percussion;

    return final_size;
}